

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_NewAwaitObject(ScriptContext *scriptContext)

{
  Recycler *recycler;
  JavascriptLibrary *this;
  DynamicType *type;
  DynamicObject *pDVar1;
  DynamicObject *awaitObject;
  ScriptContext *scriptContext_local;
  
  recycler = ScriptContext::GetRecycler(scriptContext);
  this = ScriptContext::GetLibrary(scriptContext);
  type = JavascriptLibrary::GetAwaitObjectType(this);
  pDVar1 = DynamicObject::New(recycler,type);
  return pDVar1;
}

Assistant:

Var JavascriptOperators::OP_NewAwaitObject(ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(NewAwaitObject);
        auto* awaitObject = DynamicObject::New(
            scriptContext->GetRecycler(),
            scriptContext->GetLibrary()->GetAwaitObjectType());
        return awaitObject;
        JIT_HELPER_END(NewAwaitObject);
    }